

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1156.c
# Opt level: O0

int onetest(CURL *curl,char *url,testparams *p)

{
  int iVar1;
  CURLcode CVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  undefined1 local_138 [8];
  char urlbuf [256];
  uint replyselector;
  CURLcode res;
  testparams *p_local;
  char *url_local;
  CURL *curl_local;
  
  cVar8 = (p->flags & 8) != 0;
  if ((p->flags & 2) != 0) {
    cVar8 = cVar8 + '\x02';
  }
  curl_msnprintf(local_138,0x100,"%s%04u",url,cVar8);
  iVar1 = curl_easy_setopt(curl,0x2712,local_138);
  if (iVar1 == 0) {
    uVar3 = 0;
    if ((p->flags & 1) != 0) {
      uVar3 = 3;
    }
    iVar1 = curl_easy_setopt(curl,0x15,uVar3);
    if (iVar1 == 0) {
      pcVar4 = (char *)0x0;
      if ((p->flags & 1) == 0) {
        pcVar4 = "3-1000000";
      }
      iVar1 = curl_easy_setopt(curl,0x2717,pcVar4);
      if ((iVar1 == 0) && (iVar1 = curl_easy_setopt(curl,0x2d,(p->flags & 4) != 0), iVar1 == 0)) {
        hasbody = 0;
        CVar2 = curl_easy_perform(curl);
        if (CVar2 != p->result) {
          pcVar4 = "no";
          if ((p->flags & 1) != 0) {
            pcVar4 = "yes";
          }
          pcVar5 = "no";
          if ((p->flags & 4) != 0) {
            pcVar5 = "yes";
          }
          pcVar6 = "no";
          if ((p->flags & 2) != 0) {
            pcVar6 = "yes";
          }
          pcVar7 = "no";
          if ((p->flags & 8) != 0) {
            pcVar7 = "yes";
          }
          curl_mfprintf(_stderr,
                        "bad error code (%d): resume=%s, fail=%s, http416=%s, content-range=%s, expected=%d\n"
                        ,CVar2,pcVar4,pcVar5,pcVar6,pcVar7,p->result);
          return 1;
        }
        if ((hasbody != 0) && ((p->flags & 0x10) != 0)) {
          pcVar4 = "no";
          if ((p->flags & 1) != 0) {
            pcVar4 = "yes";
          }
          pcVar5 = "no";
          if ((p->flags & 4) != 0) {
            pcVar5 = "yes";
          }
          pcVar6 = "no";
          if ((p->flags & 2) != 0) {
            pcVar6 = "yes";
          }
          pcVar7 = "no";
          if ((p->flags & 8) != 0) {
            pcVar7 = "yes";
          }
          curl_mfprintf(_stderr,
                        "body should be ignored and is not: resume=%s, fail=%s, http416=%s, content-range=%s\n"
                        ,pcVar4,pcVar5,pcVar6,pcVar7);
          return 1;
        }
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static int onetest(CURL *curl, const char *url, const testparams *p)
{
  CURLcode res;
  unsigned int replyselector;
  char urlbuf[256];

  replyselector = (p->flags & F_CONTENTRANGE)? 1: 0;
  if(p->flags & F_HTTP416)
    replyselector += 2;
  msnprintf(urlbuf, sizeof(urlbuf), "%s%04u", url, replyselector);
  test_setopt(curl, CURLOPT_URL, urlbuf);
  test_setopt(curl, CURLOPT_RESUME_FROM, (p->flags & F_RESUME)? 3: 0);
  test_setopt(curl, CURLOPT_RANGE, !(p->flags & F_RESUME)?
                                   "3-1000000": (char *) NULL);
  test_setopt(curl, CURLOPT_FAILONERROR, (p->flags & F_FAIL)? 1: 0);
  hasbody = 0;
  res = curl_easy_perform(curl);
  if(res != p->result) {
    fprintf(stderr, "bad error code (%d): resume=%s, fail=%s, http416=%s, "
                    "content-range=%s, expected=%d\n", res,
                    (p->flags & F_RESUME)? "yes": "no",
                    (p->flags & F_FAIL)? "yes": "no",
                    (p->flags & F_HTTP416)? "yes": "no",
                    (p->flags & F_CONTENTRANGE)? "yes": "no",
                    p->result);
    return 1;
  }
  if(hasbody && (p->flags & F_IGNOREBODY)) {
    fprintf(stderr, "body should be ignored and is not: resume=%s, fail=%s, "
                    "http416=%s, content-range=%s\n",
                    (p->flags & F_RESUME)? "yes": "no",
                    (p->flags & F_FAIL)? "yes": "no",
                    (p->flags & F_HTTP416)? "yes": "no",
                    (p->flags & F_CONTENTRANGE)? "yes": "no");
    return 1;
  }
  return 0;

  test_cleanup:

  return 1;
}